

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
::fulfill(AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
          *this,Status *value)

{
  Status *value_00;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> local_1f8;
  Status *local_18;
  Status *value_local;
  AdapterPromiseNode<kj::HttpClient::ConnectRequest::Status,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::ConnectRequest::Status>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Status *)this;
    value_00 = mv<kj::HttpClient::ConnectRequest::Status>(value);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::ExceptionOr(&local_1f8,value_00);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::operator=(&this->result,&local_1f8);
    ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr(&local_1f8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }